

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int ARKodeSetMassFn(void *arkode_mem,ARKLsMassFn mass)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x263;
  }
  else if (*(int *)((long)arkode_mem + 0x200) == 0) {
    msgfmt = "time-stepping module does not support non-identity mass matrices";
    iVar2 = -0x30;
    error_code = -0x30;
    line = 0x26c;
  }
  else {
    lVar1 = (**(code **)((long)arkode_mem + 0x218))(arkode_mem);
    if (lVar1 == 0) {
      msgfmt = "Mass matrix solver memory is NULL.";
      iVar2 = -6;
      error_code = -6;
      line = 0x101d;
    }
    else if (mass == (ARKLsMassFn)0x0) {
      msgfmt = "Mass-matrix routine must be non-NULL";
      iVar2 = -3;
      error_code = -3;
      line = 0x278;
    }
    else {
      if (*(long *)(lVar1 + 0x10) != 0) {
        *(ARKLsMassFn *)(lVar1 + 8) = mass;
        *(undefined8 *)(lVar1 + 0x20) = *(undefined8 *)((long)arkode_mem + 0x10);
        return 0;
      }
      msgfmt = "Mass-matrix routine cannot be supplied for NULL SUNMatrix";
      iVar2 = -3;
      error_code = -3;
      line = 0x27e;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetMassFn",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int ARKodeSetMassFn(void* arkode_mem, ARKLsMassFn mass)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* return with failure if mass cannot be used */
  if (mass == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Mass-matrix routine must be non-NULL");
    return (ARKLS_ILL_INPUT);
  }
  if (arkls_mem->M == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Mass-matrix routine cannot be supplied for NULL SUNMatrix");
    return (ARKLS_ILL_INPUT);
  }

  /* set mass matrix routine pointer and return */
  arkls_mem->mass   = mass;
  arkls_mem->M_data = ark_mem->user_data;

  return (ARKLS_SUCCESS);
}